

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseCWL.cpp
# Opt level: O0

void processEnvironment(string *command,string *classification,CWLDef *data)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>,_false,_true>,_bool>
  pVar6;
  EnvKind local_1d4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>
  local_1d0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>,_true>
  local_1a8;
  undefined1 local_1a0;
  EnvKind local_194;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>
  local_190;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>,_true>
  local_168;
  undefined1 local_160;
  EnvKind local_154;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>
  local_150;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>,_true>
  local_128;
  undefined1 local_120;
  EnvKind local_114;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>
  local_110;
  string local_e8 [32];
  ulong local_c8;
  size_type i;
  string type;
  EnvKind local_7c;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>
  local_78;
  ulong local_50;
  size_type typeStart;
  string envName;
  size_type envNameEnd;
  CWLDef *data_local;
  string *classification_local;
  string *command_local;
  
  envName.field_2._8_8_ = std::__cxx11::string::find((char)command,0x7d);
  if (envName.field_2._8_8_ != -1) {
    std::__cxx11::string::substr((ulong)&typeStart,(ulong)command);
    local_50 = std::__cxx11::string::find((char)classification,0x5c);
    if (local_50 == 0xffffffffffffffff) {
      local_7c = General;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_LConfig::LatexConfig::CWL::EnvKind,_true>
                (&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&typeStart,
                 &local_7c);
      pVar6 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>_>_>
              ::insert(&data->environments,&local_78);
      type.field_2._8_8_ =
           pVar6.first.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>,_true>
           ._M_cur;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>
      ::~pair(&local_78);
    }
    else {
      std::__cxx11::string::string((string *)&i);
      local_c8 = local_50 + 1;
      local_50 = local_c8;
      for (; uVar1 = local_c8, uVar4 = std::__cxx11::string::size(), uVar1 < uVar4;
          local_c8 = local_c8 + 1) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)classification);
        iVar3 = isalpha((int)*pcVar5);
        if (iVar3 == 0) break;
      }
      std::__cxx11::string::substr((ulong)local_e8,(ulong)classification);
      std::__cxx11::string::operator=((string *)&i,local_e8);
      std::__cxx11::string::~string(local_e8);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &i,"math");
      if (bVar2) {
        local_114 = Math;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_LConfig::LatexConfig::CWL::EnvKind,_true>
                  (&local_110,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&typeStart,
                   &local_114);
        pVar6 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>_>_>
                ::insert(&data->environments,&local_110);
        local_128._M_cur =
             (__node_type *)
             pVar6.first.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>,_true>
             ._M_cur;
        local_120 = pVar6.second;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>
        ::~pair(&local_110);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&i,"tabular");
        if (bVar2) {
          local_154 = Tabular;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_LConfig::LatexConfig::CWL::EnvKind,_true>
                    (&local_150,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&typeStart
                     ,&local_154);
          pVar6 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>_>_>
                  ::insert(&data->environments,&local_150);
          local_168._M_cur =
               (__node_type *)
               pVar6.first.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>,_true>
               ._M_cur;
          local_160 = pVar6.second;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>
          ::~pair(&local_150);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&i,"array");
          if (bVar2) {
            local_194 = Array;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_LConfig::LatexConfig::CWL::EnvKind,_true>
                      (&local_190,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &typeStart,&local_194);
            pVar6 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>_>_>
                    ::insert(&data->environments,&local_190);
            local_1a8._M_cur =
                 (__node_type *)
                 pVar6.first.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>,_true>
                 ._M_cur;
            local_1a0 = pVar6.second;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>
            ::~pair(&local_190);
          }
          else {
            local_1d4 = General;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_LConfig::LatexConfig::CWL::EnvKind,_true>
                      (&local_1d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &typeStart,&local_1d4);
            std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>_>_>
            ::insert(&data->environments,&local_1d0);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LConfig::LatexConfig::CWL::EnvKind>
            ::~pair(&local_1d0);
          }
        }
      }
      std::__cxx11::string::~string((string *)&i);
    }
    std::__cxx11::string::~string((string *)&typeStart);
  }
  return;
}

Assistant:

void processEnvironment (string &command, string &classification, CWLDef &data) {
    auto envNameEnd = command.find('}');
    if (envNameEnd == string::npos) { return; }
    string envName = command.substr(7, envNameEnd - 7); // command == \begin{name}

    auto typeStart = classification.find('\\');
    if (typeStart == string::npos) {
        data.environments.insert({envName, CWL::EnvKind::General});
    } else {
        string type {};
        auto i = ++typeStart;
        for (; i < classification.size(); i++) {
            if (!isalpha(classification[i])) { break; }
        }

        type = classification.substr(typeStart, i - typeStart);

        if (type == "math") {
            data.environments.insert({envName, CWL::EnvKind::Math});
        } else if (type == "tabular") {
            data.environments.insert({envName, CWL::EnvKind::Tabular});
        } else if (type == "array") {
            data.environments.insert({envName, CWL::EnvKind::Array});
        } else {
            data.environments.insert({envName, CWL::EnvKind::General});
        }
    }
}